

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

Read<int> __thiscall Omega_h::Comm::sources(Comm *this)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  undefined8 in_RDX;
  undefined1 *puVar3;
  undefined1 in_DIL;
  undefined7 in_register_00000039;
  Read<int> RVar4;
  
  pAVar2 = (Alloc *)CONCAT71(in_register_00000039,in_DIL);
  pAVar1 = (this->srcs_).write_.shared_alloc_.alloc;
  *(Alloc **)CONCAT71(in_register_00000039,in_DIL) = pAVar1;
  puVar3 = (undefined1 *)CONCAT71((int7)((ulong)in_RDX >> 8),pAVar1 == (Alloc *)0x0);
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    puVar3 = &entering_parallel;
    if (entering_parallel == '\x01') {
      pAVar2->size = pAVar1->size * 8 + 1;
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (pAVar2->name)._M_dataplus._M_p = (pointer)(this->srcs_).write_.shared_alloc_.direct_ptr;
  RVar4.write_.shared_alloc_.direct_ptr = puVar3;
  RVar4.write_.shared_alloc_.alloc = pAVar2;
  return (Read<int>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I32> Comm::sources() const { return srcs_; }